

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleShape.h
# Opt level: O3

bool __thiscall btTriangleShape::isInside(btTriangleShape *this,btVector3 *pt,btScalar tolerance)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  btVector3 normal;
  btVector3 pb;
  btVector3 pa;
  btVector3 local_78;
  float local_68;
  float local_64;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  local_48 = tolerance;
  uStack_44 = in_XMM0_Db;
  uStack_40 = in_XMM0_Dc;
  uStack_3c = in_XMM0_Dd;
  calcNormal(this,&local_78);
  fVar4 = (local_78.m_floats[2] * pt->m_floats[2] +
          local_78.m_floats[0] * pt->m_floats[0] + pt->m_floats[1] * local_78.m_floats[1]) -
          (local_78.m_floats[2] * this->m_vertices1[0].m_floats[2] +
          local_78.m_floats[0] * this->m_vertices1[0].m_floats[0] +
          this->m_vertices1[0].m_floats[1] * local_78.m_floats[1]);
  local_38 = -local_48;
  uStack_34 = uStack_44 ^ 0x80000000;
  uStack_30 = uStack_40 ^ 0x80000000;
  uStack_2c = uStack_3c ^ 0x80000000;
  bVar1 = false;
  if ((local_38 <= fVar4) && (bVar1 = false, fVar4 <= local_48)) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape[0x1a])(this,uVar3,&local_58,&local_68);
      fVar4 = (local_64 - local_54) * local_78.m_floats[2] -
              local_78.m_floats[1] * (local_60 - local_50);
      fVar5 = (local_60 - local_50) * local_78.m_floats[0] -
              local_78.m_floats[2] * (local_68 - local_58);
      fVar6 = (local_68 - local_58) * local_78.m_floats[1] -
              (local_64 - local_54) * local_78.m_floats[0];
      fVar7 = 1.0 / SQRT(fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5);
      fVar4 = (fVar7 * fVar6 * pt->m_floats[2] +
              fVar4 * fVar7 * pt->m_floats[0] + fVar5 * fVar7 * pt->m_floats[1]) -
              (fVar7 * fVar6 * local_50 + fVar4 * fVar7 * local_58 + fVar5 * fVar7 * local_54);
      bVar1 = local_38 <= fVar4;
      if (fVar4 < local_38) {
        return bVar1;
      }
      uVar3 = (ulong)(iVar2 + 1);
    } while (iVar2 != 2);
  }
  return bVar1;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 normal;
		calcNormal(normal);
		//distance to plane
		btScalar dist = pt.dot(normal);
		btScalar planeconst = m_vertices1[0].dot(normal);
		dist -= planeconst;
		if (dist >= -tolerance && dist <= tolerance)
		{
			//inside check on edge-planes
			int i;
			for (i=0;i<3;i++)
			{
				btVector3 pa,pb;
				getEdge(i,pa,pb);
				btVector3 edge = pb-pa;
				btVector3 edgeNormal = edge.cross(normal);
				edgeNormal.normalize();
				btScalar dist = pt.dot( edgeNormal);
				btScalar edgeConst = pa.dot(edgeNormal);
				dist -= edgeConst;
				if (dist < -tolerance)
					return false;
			}
			
			return true;
		}

		return false;
	}